

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O2

void jrtplib::RTPTime::Wait(RTPTime *delay)

{
  double dVar1;
  undefined1 auVar2 [16];
  timespec rem;
  timespec req;
  timespec local_20;
  timespec local_10;
  
  dVar1 = delay->m_t;
  if (0.0 < dVar1) {
    local_10.tv_sec = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    auVar2._8_4_ = (int)((ulong)local_10.tv_sec >> 0x20);
    auVar2._0_8_ = local_10.tv_sec;
    auVar2._12_4_ = 0x45300000;
    local_10.tv_nsec =
         (long)((dVar1 - ((auVar2._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)local_10.tv_sec) - 4503599627370496.0)))
               * 1000000000.0) & 0xffffffff;
    nanosleep(&local_10,&local_20);
  }
  return;
}

Assistant:

inline void RTPTime::Wait(const RTPTime &delay)
{
	if (delay.m_t <= 0)
		return;

	uint64_t sec = (uint64_t)delay.m_t;
	uint64_t nanosec = (uint32_t)(1e9*(delay.m_t-(double)sec));

	struct timespec req,rem;

	req.tv_sec = (time_t)sec;
	req.tv_nsec = ((long)nanosec);
	nanosleep(&req,&rem);
}